

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

msgpack_unpack_return unpacker_next(msgpack_unpacker *mpac,msgpack_unpacked *result)

{
  msgpack_unpacked *pmVar1;
  msgpack_zone *pmVar2;
  msgpack_object local_40;
  msgpack_unpack_return local_24;
  msgpack_unpacked *pmStack_20;
  int ret;
  msgpack_unpacked *result_local;
  msgpack_unpacker *mpac_local;
  
  pmStack_20 = result;
  result_local = (msgpack_unpacked *)mpac;
  msgpack_unpacked_destroy(result);
  local_24 = msgpack_unpacker_execute((msgpack_unpacker *)result_local);
  if (local_24 < MSGPACK_UNPACK_CONTINUE) {
    pmStack_20->zone = (msgpack_zone *)0x0;
    memset(&pmStack_20->data,0,0x18);
    mpac_local._4_4_ = local_24;
  }
  else if (local_24 == MSGPACK_UNPACK_CONTINUE) {
    mpac_local._4_4_ = MSGPACK_UNPACK_CONTINUE;
  }
  else {
    pmVar2 = msgpack_unpacker_release_zone((msgpack_unpacker *)result_local);
    pmVar1 = pmStack_20;
    pmStack_20->zone = pmVar2;
    msgpack_unpacker_data(&local_40,(msgpack_unpacker *)result_local);
    (pmVar1->data).type = local_40.type;
    *(undefined4 *)&(pmVar1->data).field_0x4 = local_40._4_4_;
    (pmVar1->data).via.u64 = local_40.via.u64;
    (pmVar1->data).via.array.ptr = local_40.via.array.ptr;
    mpac_local._4_4_ = MSGPACK_UNPACK_SUCCESS;
  }
  return mpac_local._4_4_;
}

Assistant:

static inline msgpack_unpack_return unpacker_next(msgpack_unpacker* mpac,
                                                  msgpack_unpacked* result)
{
    int ret;

    msgpack_unpacked_destroy(result);

    ret = msgpack_unpacker_execute(mpac);

    if(ret < 0) {
        result->zone = NULL;
        memset(&result->data, 0, sizeof(msgpack_object));
        return ret;
    }

    if(ret == 0) {
        return MSGPACK_UNPACK_CONTINUE;
    }
    result->zone = msgpack_unpacker_release_zone(mpac);
    result->data = msgpack_unpacker_data(mpac);

    return MSGPACK_UNPACK_SUCCESS;
}